

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis.c
# Opt level: O0

char * vis(char *mbdst,wchar_t c,wchar_t flags,wchar_t nextc)

{
  wchar_t wVar1;
  char local_26;
  undefined1 local_25;
  wchar_t ret;
  wchar_t wStack_20;
  char cc [2];
  wchar_t nextc_local;
  wchar_t flags_local;
  wchar_t c_local;
  char *mbdst_local;
  
  local_26 = (char)c;
  local_25 = (undefined1)nextc;
  ret = nextc;
  wStack_20 = flags;
  _flags_local = mbdst;
  wVar1 = istrsenvisx((char **)&flags_local,(size_t *)0x0,&local_26,1,flags,"",(wchar_t *)0x0);
  if (wVar1 < L'\0') {
    mbdst_local = (char *)0x0;
  }
  else {
    mbdst_local = _flags_local + wVar1;
  }
  return mbdst_local;
}

Assistant:

char *
vis(char *mbdst, int c, int flags, int nextc)
{
	char cc[2];
	int ret;

	cc[0] = c;
	cc[1] = nextc;

	ret = istrsenvisx(&mbdst, NULL, cc, 1, flags, "", NULL);
	if (ret < 0)
		return NULL;
	return mbdst + ret;
}